

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O2

Gia_Man_t * Gia_ManFraigCreateGia(Gia_Man_t *p)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Vec_Int_t *vBoxPres;
  Gia_Obj_t *pGVar5;
  undefined8 uVar6;
  Gia_Man_t *p_00;
  char *pcVar7;
  void *pvVar8;
  Gia_Man_t *pGVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  
  if (p->pManTime == (void *)0x0) {
    __assert_fail("p->pManTime != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x105,"Gia_Man_t *Gia_ManFraigCreateGia(Gia_Man_t *)");
  }
  Gia_ManIncrementTravId(p);
  Gia_ObjSetTravIdCurrent(p,p->pObjs);
  vBoxPres = Vec_IntAlloc(1000);
  pGVar5 = Gia_ManObj(p,p->nObjs + -1);
  uVar6 = *(undefined8 *)pGVar5;
  if ((-1 < (int)(uint)uVar6) || (((uint)uVar6 & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsCo(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x10d,"Gia_Man_t *Gia_ManFraigCreateGia(Gia_Man_t *)");
  }
  iVar2 = 1;
  while (((int)(uint)uVar6 < 0 && (((uint)uVar6 & 0x1fffffff) != 0x1fffffff))) {
    pGVar5 = Gia_ManFraigMarkCos(p,pGVar5,iVar2);
    uVar3 = (uint)*(undefined8 *)pGVar5;
    if ((~uVar3 & 0x1fffffff) != 0 && -1 < (int)uVar3) {
      pGVar5 = Gia_ManFraigMarkAnd(p,pGVar5);
      uVar3 = (uint)*(undefined8 *)pGVar5;
    }
    if ((uVar3 & 0x9fffffff) != 0x9fffffff) {
      __assert_fail("Gia_ObjIsCi(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                    ,0x113,"Gia_Man_t *Gia_ManFraigCreateGia(Gia_Man_t *)");
    }
    iVar2 = Gia_ManFraigCheckCis(p,pGVar5);
    pGVar5 = Gia_ManFraigMarkCis(p,pGVar5,iVar2);
    Vec_IntPush(vBoxPres,iVar2);
    uVar6 = *(undefined8 *)pGVar5;
  }
  iVar2 = vBoxPres->nSize;
  if (iVar2 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
  }
  piVar1 = vBoxPres->pArray;
  vBoxPres->nSize = iVar2 + -1;
  iVar10 = iVar2 + -2;
  for (lVar12 = 0; lVar12 < (iVar2 + -1) / 2; lVar12 = lVar12 + 1) {
    iVar4 = piVar1[lVar12];
    piVar1[lVar12] = piVar1[iVar10];
    piVar1[iVar10] = iVar4;
    iVar10 = iVar10 + -1;
  }
  if ((~*(ulong *)pGVar5 & 0x1fffffff1fffffff) != 0) {
    __assert_fail("Gia_ObjIsConst0(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x11a,"Gia_Man_t *Gia_ManFraigCreateGia(Gia_Man_t *)");
  }
  for (iVar2 = 1; iVar2 < p->nObjs; iVar2 = iVar2 + 1) {
    pGVar5 = Gia_ManObj(p,iVar2);
    if ((pGVar5 == (Gia_Obj_t *)0x0) ||
       (((undefined1  [12])*pGVar5 & (undefined1  [12])0x9fffffff) != (undefined1  [12])0x9fffffff))
    break;
    Gia_ObjSetTravIdCurrent(p,pGVar5);
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar7 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar7;
  pcVar7 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar7;
  p->pObjs->Value = 0;
  for (iVar2 = 1; iVar2 < p->nObjs; iVar2 = iVar2 + 1) {
    pGVar5 = Gia_ManObj(p,iVar2);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    iVar10 = Gia_ObjIsTravIdCurrent(p,pGVar5);
    if (iVar10 != 0) {
      uVar3 = (uint)*(ulong *)pGVar5;
      if ((uVar3 & 0x9fffffff) == 0x9fffffff) {
        uVar3 = Gia_ManAppendCi(p_00);
      }
      else {
        uVar11 = *(ulong *)pGVar5 & 0x1fffffff;
        if (uVar11 == 0x1fffffff || (int)uVar3 < 0) {
          if ((-1 < (int)uVar3) || ((int)uVar11 == 0x1fffffff)) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                          ,0x130,"Gia_Man_t *Gia_ManFraigCreateGia(Gia_Man_t *)");
          }
          iVar10 = Gia_ObjFanin0Copy(pGVar5);
          uVar3 = Gia_ManAppendCo(p_00,iVar10);
        }
        else {
          iVar10 = Gia_ObjFanin0Copy(pGVar5);
          iVar4 = Gia_ObjFanin1Copy(pGVar5);
          uVar3 = Gia_ManAppendAnd(p_00,iVar10,iVar4);
        }
      }
      pGVar5->Value = uVar3;
    }
  }
  pvVar8 = Gia_ManUpdateTimMan(p,vBoxPres);
  p_00->pManTime = pvVar8;
  if (p->pAigExtra == (Gia_Man_t *)0x0) {
    __assert_fail("p->pAigExtra != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x135,"Gia_Man_t *Gia_ManFraigCreateGia(Gia_Man_t *)");
  }
  if (p_00->pAigExtra == (Gia_Man_t *)0x0) {
    pGVar9 = Gia_ManUpdateExtraAig(p->pManTime,p->pAigExtra,vBoxPres);
    p_00->pAigExtra = pGVar9;
    Vec_IntFree(vBoxPres);
    return p_00;
  }
  __assert_fail("pNew->pAigExtra == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                ,0x136,"Gia_Man_t *Gia_ManFraigCreateGia(Gia_Man_t *)");
}

Assistant:

Gia_Man_t * Gia_ManFraigCreateGia( Gia_Man_t * p )
{
    Vec_Int_t * vBoxPres;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i, fLabelPos;
    assert( p->pManTime != NULL );
    // start marks
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    vBoxPres = Vec_IntAlloc( 1000 );
    // mark primary outputs
    fLabelPos = 1;
    pObj = Gia_ManObj( p, Gia_ManObjNum(p) - 1 );
    assert( Gia_ObjIsCo(pObj) );
    while ( Gia_ObjIsCo(pObj) )
    {
        pObj = Gia_ManFraigMarkCos( p, pObj, fLabelPos );
        if ( Gia_ObjIsAnd(pObj) )
            pObj = Gia_ManFraigMarkAnd( p, pObj );
        assert( Gia_ObjIsCi(pObj) );
        fLabelPos = Gia_ManFraigCheckCis(p, pObj);
        pObj = Gia_ManFraigMarkCis( p, pObj, fLabelPos );
        Vec_IntPush( vBoxPres, fLabelPos );
    }
    Vec_IntPop( vBoxPres );
    Vec_IntReverseOrder( vBoxPres );
    assert( Gia_ObjIsConst0(pObj) );
    // mark primary inputs
    Gia_ManForEachObj1( p, pObj, i )
        if ( Gia_ObjIsCi(pObj) )
            Gia_ObjSetTravIdCurrent( p, pObj );
        else
            break;
    // duplicate marked entries
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( !Gia_ObjIsTravIdCurrent(p, pObj) )
            continue;
        if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi(pNew);
        else if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        else assert( 0 );
    }
    // update timing manager
    pNew->pManTime = Gia_ManUpdateTimMan( p, vBoxPres );
    // update extra STG
    assert( p->pAigExtra != NULL );
    assert( pNew->pAigExtra == NULL );
    pNew->pAigExtra = Gia_ManUpdateExtraAig( p->pManTime, p->pAigExtra, vBoxPres );
    Vec_IntFree( vBoxPres );
//    assert( Gia_ManPiNum(pNew) == Tim_ManCiNum(pNew->pManTime) );
//    assert( Gia_ManPoNum(pNew) == Tim_ManCoNum(pNew->pManTime) );
//    assert( Gia_ManPiNum(pNew) == Tim_ManPiNum(pNew->pManTime) + Gia_ManPoNum(pNew->pAigExtra) );
    return pNew;
}